

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loguru.cpp
# Opt level: O2

string * loguru::prettify_stacktrace(string *__return_storage_ptr__,string *input)

{
  allocator<char> local_99;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  regex template_spaces_re;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  regex std_allocator_re;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)input);
  do_replacements((StringPairList *)s_user_stack_cleanups_abi_cxx11_,__return_storage_ptr__);
  do_replacements((StringPairList *)REPLACE_LIST_abi_cxx11_,__return_storage_ptr__);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&std_allocator_re,",\\s*std::allocator<[^<>]+>",0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"",(allocator<char> *)&local_58);
  std::
  regex_replace<std::__cxx11::regex_traits<char>,char,std::char_traits<char>,std::allocator<char>,std::char_traits<char>,std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &template_spaces_re,__return_storage_ptr__,&std_allocator_re,&local_98,0);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&template_spaces_re);
  std::__cxx11::string::~string((string *)&template_spaces_re);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&template_spaces_re,"<\\s*([^<> ]+)\\s*>",0x10);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"<$1>",&local_99);
  std::
  regex_replace<std::__cxx11::regex_traits<char>,char,std::char_traits<char>,std::allocator<char>,std::char_traits<char>,std::allocator<char>>
            (&local_98,__return_storage_ptr__,&template_spaces_re,&local_58,0);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            (&template_spaces_re);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            (&std_allocator_re);
  return __return_storage_ptr__;
}

Assistant:

std::string prettify_stacktrace(const std::string& input)
	{
		std::string output = input;

		do_replacements(s_user_stack_cleanups, output);
		do_replacements(REPLACE_LIST, output);

		try {
			std::regex std_allocator_re(R"(,\s*std::allocator<[^<>]+>)");
			output = std::regex_replace(output, std_allocator_re, std::string(""));

			std::regex template_spaces_re(R"(<\s*([^<> ]+)\s*>)");
			output = std::regex_replace(output, template_spaces_re, std::string("<$1>"));
		} catch (std::regex_error&) {
			// Probably old GCC.
		}

		return output;
	}